

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O3

void __thiscall Assimp::LWO::AnimResolver::ClearAnimRangeSetup(AnimResolver *this)

{
  _List_node_base *p_Var1;
  _List_node_base *__dest;
  size_t __n;
  void *pvVar2;
  _List_node_base *p_Var3;
  void *pvVar4;
  
  p_Var3 = (this->envelopes->
           super__List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>)._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)this->envelopes) {
    do {
      pvVar2 = *(void **)&((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                            *)((long)(p_Var3 + 2) + 8))->_M_impl;
      p_Var1 = *(_List_node_base **)
                &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                 ((long)(p_Var3 + 3) + 8))->_M_impl;
      if (p_Var1 != (_List_node_base *)0x0) {
        __dest = *(_List_node_base **)
                  &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                   (p_Var3 + 2))->_M_impl;
        pvVar4 = (void *)((long)__dest + (long)p_Var1 * 0x28);
        __n = (long)pvVar2 - (long)pvVar4;
        pvVar2 = pvVar4;
        if (__n != 0) {
          memmove(__dest,pvVar4,__n);
          pvVar2 = *(void **)&((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                                *)((long)(p_Var3 + 2) + 8))->_M_impl;
        }
        pvVar4 = (void *)((long)__dest + ((long)pvVar2 - (long)pvVar4));
        if (pvVar2 != pvVar4) {
          *(void **)&((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                     ((long)(p_Var3 + 2) + 8))->_M_impl = pvVar4;
          pvVar2 = pvVar4;
        }
      }
      pvVar4 = (void *)((long)*(_List_node_base **)
                               &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                                  *)(p_Var3 + 2))->_M_impl +
                       *(size_t *)
                        &((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                           *)(p_Var3 + 4))->_M_impl * 0x28 + 0x28);
      if (pvVar4 != pvVar2) {
        *(void **)&((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                   ((long)(p_Var3 + 2) + 8))->_M_impl = pvVar4;
      }
      p_Var3 = (((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var3 != (_List_node_base *)this->envelopes);
  }
  return;
}

Assistant:

void AnimResolver::ClearAnimRangeSetup()
{
    for (std::list<LWO::Envelope>::iterator it = envelopes.begin(); it != envelopes.end(); ++it) {

        (*it).keys.erase((*it).keys.begin(),(*it).keys.begin()+(*it).old_first);
        (*it).keys.erase((*it).keys.begin()+(*it).old_last+1,(*it).keys.end());
    }
}